

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::check_dup_param_names::test_method(check_dup_param_names *this)

{
  allocator_type *in_RCX;
  allocator_type *paVar1;
  size_type extraout_RDX;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_00;
  size_type extraout_RDX_01;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_02;
  size_type extraout_RDX_03;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_04;
  size_type extraout_RDX_05;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_06;
  size_type extraout_RDX_07;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_08;
  size_type extraout_RDX_09;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_10;
  size_type extraout_RDX_11;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_12;
  size_type extraout_RDX_13;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_14;
  size_type extraout_RDX_15;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_16;
  size_type extraout_RDX_17;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_18;
  size_type extraout_RDX_19;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_20;
  size_type extraout_RDX_21;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_22;
  size_type extraout_RDX_23;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_24;
  size_type extraout_RDX_25;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_26;
  size_type extraout_RDX_27;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_28;
  size_type extraout_RDX_29;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_30;
  size_type extraout_RDX_31;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_32;
  size_type extraout_RDX_33;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_34;
  size_type extraout_RDX_35;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  *extraout_RDX_36;
  long lVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_00;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_01;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_02;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_03;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_04;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_05;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_06;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_07;
  const_string file;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_08;
  const_string file_00;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_09;
  const_string file_01;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_10;
  const_string file_02;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_11;
  const_string file_03;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_12;
  const_string file_04;
  const_string file_05;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_13;
  const_string file_06;
  const_string file_07;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_14;
  const_string file_08;
  const_string file_09;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_15;
  const_string file_10;
  const_string file_11;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_16;
  const_string file_12;
  const_string file_13;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_17;
  const_string file_14;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  check_type cVar5;
  char *local_13e0;
  char *local_13d8;
  undefined1 *local_13d0;
  undefined1 *local_13c8;
  char *local_13c0;
  char *local_13b8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_13b0;
  undefined1 *local_1398;
  undefined1 *local_1390;
  char *local_1388;
  char *local_1380;
  char *local_1348;
  char *local_1340;
  undefined1 *local_1338;
  undefined1 *local_1330;
  char *local_1328;
  char *local_1320;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_1318;
  undefined1 *local_1300;
  undefined1 *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12b0;
  char *local_12a8;
  undefined1 *local_12a0;
  undefined1 *local_1298;
  char *local_1290;
  char *local_1288;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_1280;
  undefined1 *local_1268;
  undefined1 *local_1260;
  char *local_1258;
  char *local_1250;
  char *local_1218;
  char *local_1210;
  undefined1 *local_1208;
  undefined1 *local_1200;
  char *local_11f8;
  char *local_11f0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_11e8;
  undefined1 *local_11d0;
  undefined1 *local_11c8;
  char *local_11c0;
  char *local_11b8;
  char *local_1180;
  char *local_1178;
  undefined1 *local_1170;
  undefined1 *local_1168;
  char *local_1160;
  char *local_1158;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_1150;
  undefined1 *local_1138;
  undefined1 *local_1130;
  char *local_1128;
  char *local_1120;
  char *local_10e8;
  char *local_10e0;
  undefined1 *local_10d8;
  undefined1 *local_10d0;
  char *local_10c8;
  char *local_10c0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_10b8;
  undefined1 *local_10a0;
  undefined1 *local_1098;
  char *local_1090;
  char *local_1088;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_1080 [3];
  char *local_1038;
  char *local_1030;
  undefined1 *local_1028;
  undefined1 *local_1020;
  char *local_1018;
  char *local_1010;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_1008;
  undefined1 *local_ff0;
  undefined1 *local_fe8;
  char *local_fe0;
  char *local_fd8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_fd0 [3];
  char *local_f88;
  char *local_f80;
  assertion_result local_f78;
  undefined1 *local_f60;
  undefined1 *local_f58;
  char *local_f50;
  char *local_f48;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_f40;
  undefined1 *local_f28;
  undefined1 *local_f20;
  char *local_f18;
  char *local_f10;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_f08;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_ef0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_ed8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_ec0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_ea8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_e90;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_e78;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_e60;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_e48;
  RPCHelpMan local_e30;
  RPCHelpMan local_d78;
  RPCHelpMan local_cc0;
  RPCHelpMan local_c08;
  RPCHelpMan local_b50;
  RPCHelpMan local_a98;
  RPCHelpMan local_9e0;
  RPCHelpMan local_928;
  RPCHelpMan local_870;
  RPCHelpMan local_7b8;
  RPCHelpMan local_700;
  RPCHelpMan local_648;
  RPCHelpMan local_590;
  RPCHelpMan local_4d8;
  RPCHelpMan local_420;
  RPCHelpMan local_368;
  RPCHelpMan local_2b0;
  RPCHelpMan local_1f8;
  undefined1 local_140 [8];
  _Head_base<0ul,std::__cxx11::string,false> local_138 [8];
  undefined1 *local_130;
  char *local_128;
  undefined4 local_118;
  _Head_base<0ul,std::__cxx11::string,false> local_110 [32];
  RPCHelpMan local_f0;
  long local_38;
  
  local_1030 = (char *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 0;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba791f);
  __l._M_len = extraout_RDX;
  __l._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_e48,__l,in_RCX);
  test_method::anon_class_1_0_00000001::operator()
            (&local_f0,(anon_class_1_0_00000001 *)&local_e48,extraout_RDX_00);
  RPCHelpMan::~RPCHelpMan(&local_f0);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_e48);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba791f);
  __l_00._M_len = extraout_RDX_01;
  __l_00._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_e60,__l_00,in_RCX);
  test_method::anon_class_1_0_00000001::operator()
            (&local_1f8,(anon_class_1_0_00000001 *)&local_e60,extraout_RDX_02);
  RPCHelpMan::~RPCHelpMan(&local_1f8);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_e60);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba791f);
  __l_01._M_len = extraout_RDX_03;
  __l_01._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_e78,__l_01,in_RCX);
  test_method::anon_class_1_0_00000001::operator()
            (&local_2b0,(anon_class_1_0_00000001 *)&local_e78,extraout_RDX_04);
  RPCHelpMan::~RPCHelpMan(&local_2b0);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_e78);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 0;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba791f);
  __l_02._M_len = extraout_RDX_05;
  __l_02._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_e90,__l_02,in_RCX);
  test_method::anon_class_1_0_00000001::operator()
            (&local_368,(anon_class_1_0_00000001 *)&local_e90,extraout_RDX_06);
  RPCHelpMan::~RPCHelpMan(&local_368);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_e90);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba791f);
  __l_03._M_len = extraout_RDX_07;
  __l_03._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_ea8,__l_03,in_RCX);
  test_method::anon_class_1_0_00000001::operator()
            (&local_420,(anon_class_1_0_00000001 *)&local_ea8,extraout_RDX_08);
  RPCHelpMan::~RPCHelpMan(&local_420);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_ea8);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba791f);
  __l_04._M_len = extraout_RDX_09;
  __l_04._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_ec0,__l_04,in_RCX);
  test_method::anon_class_1_0_00000001::operator()
            (&local_4d8,(anon_class_1_0_00000001 *)&local_ec0,extraout_RDX_10);
  RPCHelpMan::~RPCHelpMan(&local_4d8);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_ec0);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 0;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba791f);
  __l_05._M_len = extraout_RDX_11;
  __l_05._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_ed8,__l_05,in_RCX);
  test_method::anon_class_1_0_00000001::operator()
            (&local_590,(anon_class_1_0_00000001 *)&local_ed8,extraout_RDX_12);
  RPCHelpMan::~RPCHelpMan(&local_590);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_ed8);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba791f);
  __l_06._M_len = extraout_RDX_13;
  __l_06._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_ef0,__l_06,in_RCX);
  test_method::anon_class_1_0_00000001::operator()
            (&local_648,(anon_class_1_0_00000001 *)&local_ef0,extraout_RDX_14);
  RPCHelpMan::~RPCHelpMan(&local_648);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_ef0);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_140._0_4_ = 2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba791f);
  __l_07._M_len = extraout_RDX_15;
  __l_07._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_f08,__l_07,in_RCX);
  test_method::anon_class_1_0_00000001::operator()
            (&local_700,(anon_class_1_0_00000001 *)&local_f08,extraout_RDX_16);
  RPCHelpMan::~RPCHelpMan(&local_700);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_f08);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_f18 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f10 = "";
  paVar1 = (allocator_type *)&local_f28;
  local_f28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f20 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x21a;
  file.m_begin = (iterator)&local_f18;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)paVar1,msg);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 0;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba7948);
  __l_08._M_len = extraout_RDX_17;
  __l_08._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_f40,__l_08,paVar1);
  test_method::anon_class_1_0_00000001::operator()
            (&local_7b8,(anon_class_1_0_00000001 *)&local_f40,extraout_RDX_18);
  RPCHelpMan::~RPCHelpMan(&local_7b8);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_f40);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_f50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f48 = "";
  local_f60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x21a;
  file_00.m_begin = (iterator)&local_f50;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f60,
             msg_00);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138[0] = (_Head_base<0ul,std::__cxx11::string,false>)0x0;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_011489c8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "exception NonFatalCheckError expected but not raised";
  local_f88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f80 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  paVar1 = (allocator_type *)0x21a;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar5,(size_t)&local_f88,0x21a);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba7948);
  __l_09._M_len = extraout_RDX_19;
  __l_09._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(local_fd0,__l_09,paVar1);
  test_method::anon_class_1_0_00000001::operator()
            (&local_870,(anon_class_1_0_00000001 *)local_fd0,extraout_RDX_20);
  RPCHelpMan::~RPCHelpMan(&local_870);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(local_fd0);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_fe0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_fd8 = "";
  paVar1 = (allocator_type *)&local_ff0;
  local_ff0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fe8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x21c;
  file_01.m_begin = (iterator)&local_fe0;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)paVar1,msg_01);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba7948);
  __l_10._M_len = extraout_RDX_21;
  __l_10._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_1008,__l_10,paVar1);
  test_method::anon_class_1_0_00000001::operator()
            (&local_928,(anon_class_1_0_00000001 *)&local_1008,extraout_RDX_22);
  RPCHelpMan::~RPCHelpMan(&local_928);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_1008);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_1018 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1010 = "";
  local_1028 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1020 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x21c;
  file_02.m_begin = (iterator)&local_1018;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1028,
             msg_02);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138[0] = (_Head_base<0ul,std::__cxx11::string,false>)0x0;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_011489c8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "exception NonFatalCheckError expected but not raised";
  local_1038 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1030 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  paVar1 = (allocator_type *)0x21c;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar5,(size_t)&local_1038,0x21c);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 0;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba7948);
  __l_11._M_len = extraout_RDX_23;
  __l_11._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(local_1080,__l_11,paVar1);
  test_method::anon_class_1_0_00000001::operator()
            (&local_9e0,(anon_class_1_0_00000001 *)local_1080,extraout_RDX_24);
  RPCHelpMan::~RPCHelpMan(&local_9e0);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(local_1080);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_1090 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1088 = "";
  paVar1 = (allocator_type *)&local_10a0;
  local_10a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x21e;
  file_03.m_begin = (iterator)&local_1090;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)paVar1,msg_03);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba7948);
  __l_12._M_len = extraout_RDX_25;
  __l_12._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_10b8,__l_12,paVar1);
  test_method::anon_class_1_0_00000001::operator()
            (&local_a98,(anon_class_1_0_00000001 *)&local_10b8,extraout_RDX_26);
  RPCHelpMan::~RPCHelpMan(&local_a98);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_10b8);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_10c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10c0 = "";
  local_10d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x21e;
  file_04.m_begin = (iterator)&local_10c8;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_10d8,
             msg_04);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138[0] = (_Head_base<0ul,std::__cxx11::string,false>)0x0;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_011489c8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "exception NonFatalCheckError expected but not raised";
  local_10e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10e0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar5,(size_t)&local_10e8,0x21e);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_1128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1120 = "";
  paVar1 = (allocator_type *)&local_1138;
  local_1138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x21f;
  file_05.m_begin = (iterator)&local_1128;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)paVar1,msg_05);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba7948);
  __l_13._M_len = extraout_RDX_27;
  __l_13._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_1150,__l_13,paVar1);
  test_method::anon_class_1_0_00000001::operator()
            (&local_b50,(anon_class_1_0_00000001 *)&local_1150,extraout_RDX_28);
  RPCHelpMan::~RPCHelpMan(&local_b50);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_1150);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_1160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1158 = "";
  local_1170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x21f;
  file_06.m_begin = (iterator)&local_1160;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1170,
             msg_06);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138[0] = (_Head_base<0ul,std::__cxx11::string,false>)0x0;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_011489c8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "exception NonFatalCheckError expected but not raised";
  local_1180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1178 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar5,(size_t)&local_1180,0x21f);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_11c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11b8 = "";
  paVar1 = (allocator_type *)&local_11d0;
  local_11d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x220;
  file_07.m_begin = (iterator)&local_11c0;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)paVar1,msg_07);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 0;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba7948);
  __l_14._M_len = extraout_RDX_29;
  __l_14._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_11e8,__l_14,paVar1);
  test_method::anon_class_1_0_00000001::operator()
            (&local_c08,(anon_class_1_0_00000001 *)&local_11e8,extraout_RDX_30);
  RPCHelpMan::~RPCHelpMan(&local_c08);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_11e8);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_11f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11f0 = "";
  local_1208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x220;
  file_08.m_begin = (iterator)&local_11f8;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_1208,
             msg_08);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138[0] = (_Head_base<0ul,std::__cxx11::string,false>)0x0;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_011489c8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "exception NonFatalCheckError expected but not raised";
  local_1218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1210 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar5,(size_t)&local_1218,0x220);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_1258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1250 = "";
  paVar1 = (allocator_type *)&local_1268;
  local_1268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x221;
  file_09.m_begin = (iterator)&local_1258;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)paVar1,msg_09);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba7948);
  __l_15._M_len = extraout_RDX_31;
  __l_15._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_1280,__l_15,paVar1);
  test_method::anon_class_1_0_00000001::operator()
            (&local_cc0,(anon_class_1_0_00000001 *)&local_1280,extraout_RDX_32);
  RPCHelpMan::~RPCHelpMan(&local_cc0);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_1280);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_1290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1288 = "";
  local_12a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x221;
  file_10.m_begin = (iterator)&local_1290;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_12a0,
             msg_10);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138[0] = (_Head_base<0ul,std::__cxx11::string,false>)0x0;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_011489c8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "exception NonFatalCheckError expected but not raised";
  local_12b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12a8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar5,(size_t)&local_12b0,0x221);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_12f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12e8 = "";
  paVar1 = (allocator_type *)&local_1300;
  local_1300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x222;
  file_11.m_begin = (iterator)&local_12f0;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)paVar1,msg_11);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_110,(char (*) [3])0xba7948);
  __l_16._M_len = extraout_RDX_33;
  __l_16._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_1318,__l_16,paVar1);
  test_method::anon_class_1_0_00000001::operator()
            (&local_d78,(anon_class_1_0_00000001 *)&local_1318,extraout_RDX_34);
  RPCHelpMan::~RPCHelpMan(&local_d78);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_1318);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_1328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1320 = "";
  local_1338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x222;
  file_12.m_begin = (iterator)&local_1328;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_1338,
             msg_12);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138[0] = (_Head_base<0ul,std::__cxx11::string,false>)0x0;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_011489c8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "exception NonFatalCheckError expected but not raised";
  local_1348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1340 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar5,(size_t)&local_1348,0x222);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_1388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1380 = "";
  paVar1 = (allocator_type *)&local_1398;
  local_1398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x225;
  file_13.m_begin = (iterator)&local_1388;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)paVar1,msg_13);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[3]>
            (local_138,(char (*) [3])0xba7948);
  local_118 = 2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[6]>
            (local_110,(char (*) [6])"p2|p1");
  __l_17._M_len = extraout_RDX_35;
  __l_17._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_13b0,__l_17,paVar1);
  test_method::anon_class_1_0_00000001::operator()
            (&local_e30,(anon_class_1_0_00000001 *)&local_13b0,extraout_RDX_36);
  RPCHelpMan::~RPCHelpMan(&local_e30);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_13b0);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_138 + lVar2 + -8));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  local_13c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13b8 = "";
  local_13d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_13c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x225;
  file_14.m_begin = (iterator)&local_13c0;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_13d0,
             msg_14);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138[0] = (_Head_base<0ul,std::__cxx11::string,false>)0x0;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_011489c8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = "exception NonFatalCheckError expected but not raised";
  local_13e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13d8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar5,(size_t)&local_13e0,0x225);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_dup_param_names)
{
    enum ParamType { POSITIONAL, NAMED, NAMED_ONLY };
    auto make_rpc = [](std::vector<std::tuple<std::string, ParamType>> param_names) {
        std::vector<RPCArg> params;
        std::vector<RPCArg> options;
        auto push_options = [&] { if (!options.empty()) params.emplace_back(strprintf("options%i", params.size()), RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "", std::move(options)); };
        for (auto& [param_name, param_type] : param_names) {
            if (param_type == POSITIONAL) {
                push_options();
                params.emplace_back(std::move(param_name), RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "description");
            } else {
                options.emplace_back(std::move(param_name), RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "description", RPCArgOptions{.also_positional = param_type == NAMED});
            }
        }
        push_options();
        return RPCHelpMan{"method_name", "description", params, RPCResults{}, RPCExamples{""}};
    };

    // No errors if parameter names are unique.
    make_rpc({{"p1", POSITIONAL}, {"p2", POSITIONAL}});
    make_rpc({{"p1", POSITIONAL}, {"p2", NAMED}});
    make_rpc({{"p1", POSITIONAL}, {"p2", NAMED_ONLY}});
    make_rpc({{"p1", NAMED}, {"p2", POSITIONAL}});
    make_rpc({{"p1", NAMED}, {"p2", NAMED}});
    make_rpc({{"p1", NAMED}, {"p2", NAMED_ONLY}});
    make_rpc({{"p1", NAMED_ONLY}, {"p2", POSITIONAL}});
    make_rpc({{"p1", NAMED_ONLY}, {"p2", NAMED}});
    make_rpc({{"p1", NAMED_ONLY}, {"p2", NAMED_ONLY}});

    // Error if parameters names are duplicates, unless one parameter is
    // positional and the other is named and .also_positional is true.
    BOOST_CHECK_THROW(make_rpc({{"p1", POSITIONAL}, {"p1", POSITIONAL}}), NonFatalCheckError);
    make_rpc({{"p1", POSITIONAL}, {"p1", NAMED}});
    BOOST_CHECK_THROW(make_rpc({{"p1", POSITIONAL}, {"p1", NAMED_ONLY}}), NonFatalCheckError);
    make_rpc({{"p1", NAMED}, {"p1", POSITIONAL}});
    BOOST_CHECK_THROW(make_rpc({{"p1", NAMED}, {"p1", NAMED}}), NonFatalCheckError);
    BOOST_CHECK_THROW(make_rpc({{"p1", NAMED}, {"p1", NAMED_ONLY}}), NonFatalCheckError);
    BOOST_CHECK_THROW(make_rpc({{"p1", NAMED_ONLY}, {"p1", POSITIONAL}}), NonFatalCheckError);
    BOOST_CHECK_THROW(make_rpc({{"p1", NAMED_ONLY}, {"p1", NAMED}}), NonFatalCheckError);
    BOOST_CHECK_THROW(make_rpc({{"p1", NAMED_ONLY}, {"p1", NAMED_ONLY}}), NonFatalCheckError);

    // Make sure duplicate aliases are detected too.
    BOOST_CHECK_THROW(make_rpc({{"p1", POSITIONAL}, {"p2|p1", NAMED_ONLY}}), NonFatalCheckError);
}